

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::generic_parser_base::printGenericOptionDiff
          (generic_parser_base *this,Option *O,GenericOptionValue *Value,GenericOptionValue *Default
          ,size_t GlobalWidth)

{
  StringRef Str;
  StringRef Str_00;
  size_t sVar1;
  GenericOptionValue *pGVar2;
  int iVar3;
  uint uVar4;
  raw_ostream *prVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  undefined4 extraout_var_02;
  size_t extraout_RDX;
  ulong extraout_RDX_00;
  size_t extraout_RDX_01;
  uint local_c0;
  uint local_8c;
  uint j;
  size_t NumSpaces;
  size_t L;
  uint local_58;
  uint local_54;
  uint i;
  uint NumOpts;
  _func_int **local_48;
  size_t local_40;
  size_t GlobalWidth_local;
  GenericOptionValue *Default_local;
  GenericOptionValue *Value_local;
  Option *O_local;
  generic_parser_base *this_local;
  GenericOptionValue *local_10;
  
  local_40 = GlobalWidth;
  GlobalWidth_local = (size_t)Default;
  Default_local = Value;
  Value_local = (GenericOptionValue *)O;
  O_local = (Option *)this;
  prVar5 = outs();
  prVar5 = raw_ostream::operator<<(prVar5,"  -");
  _i = ((StringRef *)(Value_local + 3))->Data;
  local_48 = Value_local[4]._vptr_GenericOptionValue;
  raw_ostream::operator<<(prVar5,*(StringRef *)(Value_local + 3));
  prVar5 = outs();
  local_10 = Value_local + 3;
  raw_ostream::indent(prVar5,(int)local_40 - (int)Value_local[4]._vptr_GenericOptionValue);
  local_54 = (*this->_vptr_generic_parser_base[2])();
  local_58 = 0;
  while( true ) {
    pGVar2 = Default_local;
    if (local_58 == local_54) {
      prVar5 = outs();
      raw_ostream::operator<<(prVar5,"= *unknown option value*\n");
      return;
    }
    iVar3 = (*this->_vptr_generic_parser_base[6])(this,(ulong)local_58);
    uVar4 = (**pGVar2->_vptr_GenericOptionValue)(pGVar2,CONCAT44(extraout_var,iVar3));
    if ((uVar4 & 1) == 0) break;
    local_58 = local_58 + 1;
  }
  prVar5 = outs();
  prVar5 = raw_ostream::operator<<(prVar5,"= ");
  iVar3 = (*this->_vptr_generic_parser_base[3])(this,(ulong)local_58);
  L = CONCAT44(extraout_var_00,iVar3);
  Str_00.Length = extraout_RDX;
  Str_00.Data = (char *)L;
  raw_ostream::operator<<(prVar5,Str_00);
  iVar3 = (*this->_vptr_generic_parser_base[3])(this,(ulong)local_58);
  NumSpaces = CONCAT44(extraout_var_01,iVar3);
  this_local = (generic_parser_base *)&NumSpaces;
  if (extraout_RDX_00 < 8) {
    local_c0 = 8 - (int)extraout_RDX_00;
  }
  else {
    local_c0 = 0;
  }
  prVar5 = outs();
  prVar5 = raw_ostream::indent(prVar5,local_c0);
  raw_ostream::operator<<(prVar5," (default: ");
  local_8c = 0;
  do {
    sVar1 = GlobalWidth_local;
    if (local_8c == local_54) {
LAB_00182e14:
      prVar5 = outs();
      raw_ostream::operator<<(prVar5,")\n");
      return;
    }
    iVar3 = (*this->_vptr_generic_parser_base[6])(this,(ulong)local_8c);
    uVar6 = (*(code *)**(undefined8 **)sVar1)(sVar1,iVar3);
    if ((uVar6 & 1) == 0) {
      prVar5 = outs();
      iVar3 = (*this->_vptr_generic_parser_base[3])(this,(ulong)local_8c);
      Str.Data._4_4_ = extraout_var_02;
      Str.Data._0_4_ = iVar3;
      Str.Length = extraout_RDX_01;
      raw_ostream::operator<<(prVar5,Str);
      goto LAB_00182e14;
    }
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

void generic_parser_base::printGenericOptionDiff(
    const Option &O, const GenericOptionValue &Value,
    const GenericOptionValue &Default, size_t GlobalWidth) const {
  outs() << "  -" << O.ArgStr;
  outs().indent(GlobalWidth - O.ArgStr.size());

  unsigned NumOpts = getNumOptions();
  for (unsigned i = 0; i != NumOpts; ++i) {
    if (Value.compare(getOptionValue(i)))
      continue;

    outs() << "= " << getOption(i);
    size_t L = getOption(i).size();
    size_t NumSpaces = MaxOptWidth > L ? MaxOptWidth - L : 0;
    outs().indent(NumSpaces) << " (default: ";
    for (unsigned j = 0; j != NumOpts; ++j) {
      if (Default.compare(getOptionValue(j)))
        continue;
      outs() << getOption(j);
      break;
    }
    outs() << ")\n";
    return;
  }
  outs() << "= *unknown option value*\n";
}